

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

char * js_strndup(JSContext *ctx,char *s,size_t n)

{
  char *__dest;
  size_t in_RDX;
  void *in_RSI;
  JSContext *in_RDI;
  char *ptr;
  
  __dest = (char *)js_malloc(in_RDI,(size_t)in_RSI);
  if (__dest != (char *)0x0) {
    memcpy(__dest,in_RSI,in_RDX);
    __dest[in_RDX] = '\0';
  }
  return __dest;
}

Assistant:

char *js_strndup(JSContext *ctx, const char *s, size_t n)
{
    char *ptr;
    ptr = js_malloc(ctx, n + 1);
    if (ptr) {
        memcpy(ptr, s, n);
        ptr[n] = '\0';
    }
    return ptr;
}